

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

string * __thiscall roaring::Roaring64Map::toString_abi_cxx11_(Roaring64Map *this)

{
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_RSI;
  string *in_RDI;
  anon_class_8_1_6971b95b sink;
  string *result;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_00000108;
  Roaring64Map *in_stack_00000110;
  string *__f;
  
  __f = in_RDI;
  std::__cxx11::string::string(in_RDI);
  std::function<void(std::__cxx11::string_const&)>::
  function<roaring::Roaring64Map::toString()const::_lambda(std::__cxx11::string_const&)_1_&,void>
            (in_RSI,(anon_class_8_1_6971b95b *)__f);
  printToSink(in_stack_00000110,in_stack_00000108);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x127418);
  return in_RDI;
}

Assistant:

std::string toString() const {
        std::string result;
        auto sink = [&result](const std::string &s) { result += s; };
        printToSink(sink);
        return result;
    }